

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yprc_bits_enum(lys_ypr_ctx *pctx,lysc_type_bitenum_item *items,LY_DATA_TYPE basetype,
                   ly_bool *flag)

{
  uint16_t *puVar1;
  ulong uVar2;
  uint16_t *puVar3;
  ulong uVar4;
  ly_bool *attr_value;
  ly_bool *in_R9;
  char *pcVar5;
  ly_bool inner_flag;
  LY_DATA_TYPE local_3c;
  ly_bool *local_38;
  
  local_38 = flag;
  if ((basetype != LY_TYPE_BITS) && (basetype != LY_TYPE_ENUM)) {
    __assert_fail("(basetype == LY_TYPE_BITS) || (basetype == LY_TYPE_ENUM)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_yang.c"
                  ,0x32c,
                  "void yprc_bits_enum(struct lys_ypr_ctx *, const struct lysc_type_bitenum_item *, LY_DATA_TYPE, ly_bool *)"
                 );
  }
  pcVar5 = "enum";
  if (basetype == LY_TYPE_BITS) {
    pcVar5 = "bit";
  }
  puVar3 = &items->flags;
  uVar4 = 0;
  local_3c = basetype;
  while( true ) {
    if (items == (lysc_type_bitenum_item *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2._0_4_ = items[-1].field_4;
      uVar2._4_2_ = items[-1].flags;
      uVar2._6_2_ = *(undefined2 *)&items[-1].field_0x26;
    }
    if (uVar2 <= uVar4) break;
    inner_flag = '\0';
    ypr_open((pctx->field_0).field_0.out,local_38);
    uVar2 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar2 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*s%s \"",uVar2,"",pcVar5);
    ypr_encode((pctx->field_0).field_0.out,((lysc_type_bitenum_item *)(puVar3 + -0x12))->name,-1);
    ly_print_((pctx->field_0).field_0.out,"\"");
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    if (local_3c == LY_TYPE_BITS) {
      yprc_extension_instances
                (pctx,LY_STMT_BIT,'\0',*(lysc_ext_instance **)(puVar3 + -6),&inner_flag);
      ypr_unsigned(pctx,LY_STMT_POSITION,(uint8_t)*(lysc_ext_instance **)(puVar3 + -6),
                   (void *)(ulong)((anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *)
                                  (puVar3 + -2))->position,(unsigned_long)&inner_flag,in_R9);
    }
    else {
      attr_value = &inner_flag;
      yprc_extension_instances
                (pctx,LY_STMT_ENUM,'\0',*(lysc_ext_instance **)(puVar3 + -6),&inner_flag);
      ypr_signed(pctx,(ly_stmt)*(lysc_ext_instance **)(puVar3 + -6),
                 (uint8_t)((anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *)(puVar3 + -2))->
                          position,&inner_flag,(long)attr_value,in_R9);
    }
    ypr_status(pctx,*puVar3,*(lysc_ext_instance **)(puVar3 + -6),&inner_flag);
    ypr_description(pctx,*(char **)(puVar3 + -0xe),*(lysc_ext_instance **)(puVar3 + -6),&inner_flag)
    ;
    ypr_reference(pctx,*(char **)(puVar3 + -10),*(lysc_ext_instance **)(puVar3 + -6),&inner_flag);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,inner_flag);
    uVar4 = uVar4 + 1;
    puVar3 = puVar3 + 0x14;
  }
  return;
}

Assistant:

static void
yprc_bits_enum(struct lys_ypr_ctx *pctx, const struct lysc_type_bitenum_item *items, LY_DATA_TYPE basetype, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    const struct lysc_type_bitenum_item *item;
    ly_bool inner_flag;

    assert((basetype == LY_TYPE_BITS) || (basetype == LY_TYPE_ENUM));

    LY_ARRAY_FOR(items, u) {
        item = &items[u];
        inner_flag = 0;

        ypr_open(pctx->out, flag);
        ly_print_(pctx->out, "%*s%s \"", INDENT, basetype == LY_TYPE_BITS ? "bit" : "enum");
        ypr_encode(pctx->out, item->name, -1);
        ly_print_(pctx->out, "\"");
        LEVEL++;
        if (basetype == LY_TYPE_BITS) {
            yprc_extension_instances(pctx, LY_STMT_BIT, 0, item->exts, &inner_flag);
            ypr_unsigned(pctx, LY_STMT_POSITION, 0, item->exts, item->position, &inner_flag);
        } else { /* LY_TYPE_ENUM */
            yprc_extension_instances(pctx, LY_STMT_ENUM, 0, item->exts, &inner_flag);
            ypr_signed(pctx, LY_STMT_VALUE, 0, item->exts, item->value, &inner_flag);
        }
        ypr_status(pctx, item->flags, item->exts, &inner_flag);
        ypr_description(pctx, item->dsc, item->exts, &inner_flag);
        ypr_reference(pctx, item->ref, item->exts, &inner_flag);
        LEVEL--;
        ypr_close(pctx, inner_flag);
    }
}